

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_862632::X509Test_TrustedFirst_Test::TestBody(X509Test_TrustedFirst_Test *this)

{
  UniquePtr<EVP_PKEY> UVar1;
  UniquePtr<X509> UVar2;
  int iVar3;
  ASN1_TIME *s;
  ASN1_TIME *pAVar4;
  EVP_MD *pEVar5;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar6;
  char *in_R9;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  allocator_type local_182;
  allocator_type local_181;
  AssertionResult gtest_ar;
  string local_170;
  AssertionResult gtest_ar_;
  _Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_138;
  int local_114;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<X509> leaf;
  UniquePtr<X509> intermediate;
  int local_f4;
  UniquePtr<X509> root1_cross;
  UniquePtr<X509> root1;
  UniquePtr<X509> root2;
  tuple<x509_st_*,_bssl::internal::Deleter> local_d8;
  tuple<x509_st_*,_bssl::internal::Deleter> local_d0;
  tuple<x509_st_*,_bssl::internal::Deleter> local_c8;
  tuple<x509_st_*,_bssl::internal::Deleter> local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_862632 *)&key,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&gtest_ar_,(AssertionResult *)0x55f7b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x10b2,local_170._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_170);
    if (local_138._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_138._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_00366d69;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  MakeTestCert((anon_unknown_dwarf_862632 *)&root2,"Root 2","Root 2",
               (EVP_PKEY *)
               key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,true);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
       root2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
      root2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&gtest_ar_,(AssertionResult *)"root2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x10b6,local_170._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_138);
LAB_00366349:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    std::__cxx11::string::~string((string *)&local_170);
    if (local_138._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_138._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    s = X509_getm_notAfter((X509 *)root2._M_t.
                                   super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
    pAVar4 = ASN1_TIME_adj((ASN1_TIME *)s,0x57e9b680,0,-1);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = pAVar4 != (ASN1_TIME *)0x0;
    if (pAVar4 == (ASN1_TIME *)0x0) {
      testing::Message::Message((Message *)&local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_170,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "ASN1_TIME_adj(X509_getm_notAfter(root2.get()), kReferenceTime, 0, -1)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x10b9,local_170._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_138);
      goto LAB_00366349;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    UVar2 = root2;
    UVar1 = key;
    pEVar5 = EVP_sha256();
    iVar3 = X509_sign((X509 *)UVar2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                      (EVP_PKEY *)
                      UVar1._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,pEVar5);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar3 != 0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_170,(internal *)&gtest_ar_,
                 (AssertionResult *)"X509_sign(root2.get(), key.get(), EVP_sha256())","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x10ba,local_170._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_138);
      goto LAB_00366349;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    MakeTestCert((anon_unknown_dwarf_862632 *)&root1,"Root 1","Root 1",
                 (EVP_PKEY *)
                 key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,true);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
         root1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        root1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_170,(internal *)&gtest_ar_,(AssertionResult *)"root1","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x10be,local_170._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_138);
LAB_00366432:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
      std::__cxx11::string::~string((string *)&local_170);
      if (local_138._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)(*local_138._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      UVar2 = root1;
      UVar1 = key;
      pEVar5 = EVP_sha256();
      iVar3 = X509_sign((X509 *)UVar2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                        (EVP_PKEY *)
                        UVar1._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,pEVar5);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar3 != 0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_170,(internal *)&gtest_ar_,
                   (AssertionResult *)"X509_sign(root1.get(), key.get(), EVP_sha256())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x10bf,local_170._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_138);
        goto LAB_00366432;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      MakeTestCert((anon_unknown_dwarf_862632 *)&root1_cross,"Root 2","Root 1",
                   (EVP_PKEY *)
                   key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,true);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
           root1_cross._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
          root1_cross._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&local_138);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_170,(internal *)&gtest_ar_,(AssertionResult *)"root1_cross","false","true"
                   ,in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x10c3,local_170._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_138);
LAB_0036651b:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
        std::__cxx11::string::~string((string *)&local_170);
        if (local_138._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)(*local_138._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        UVar2 = root1_cross;
        UVar1 = key;
        pEVar5 = EVP_sha256();
        iVar3 = X509_sign((X509 *)UVar2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                  ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                          (EVP_PKEY *)
                          UVar1._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,pEVar5);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar3 != 0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_138);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_170,(internal *)&gtest_ar_,
                     (AssertionResult *)"X509_sign(root1_cross.get(), key.get(), EVP_sha256())",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x10c4,local_170._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar,(Message *)&local_138);
          goto LAB_0036651b;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        MakeTestCert((anon_unknown_dwarf_862632 *)&intermediate,"Root 1","Intermediate",
                     (EVP_PKEY *)
                     key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,true);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
             intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
            intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&local_138);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_170,(internal *)&gtest_ar_,(AssertionResult *)0x4fe128,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x10c8,local_170._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar,(Message *)&local_138);
LAB_00366604:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
          std::__cxx11::string::~string((string *)&local_170);
          if (local_138._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_138._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          UVar2 = intermediate;
          UVar1 = key;
          pEVar5 = EVP_sha256();
          iVar3 = X509_sign((X509 *)UVar2._M_t.
                                    super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                            (EVP_PKEY *)
                            UVar1._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,pEVar5);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar3 != 0;
          if (iVar3 == 0) {
            testing::Message::Message((Message *)&local_138);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_170,(internal *)&gtest_ar_,
                       (AssertionResult *)"X509_sign(intermediate.get(), key.get(), EVP_sha256())",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x10c9,local_170._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar,(Message *)&local_138);
            goto LAB_00366604;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          MakeTestCert((anon_unknown_dwarf_862632 *)&leaf,"Intermediate","Leaf",
                       (EVP_PKEY *)
                       key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,false);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
               leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
          if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
              leaf._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&local_138);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_170,(internal *)&gtest_ar_,(AssertionResult *)0x4fe166,"false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x10cd,local_170._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar,(Message *)&local_138);
LAB_003666ed:
            this_00 = &gtest_ar_.message_;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
            std::__cxx11::string::~string((string *)&local_170);
            if (local_138._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (*(code *)(*local_138._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
            }
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            UVar2 = leaf;
            pEVar5 = EVP_sha256();
            iVar3 = X509_sign((X509 *)UVar2._M_t.
                                      super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                              (EVP_PKEY *)
                              key._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                              _M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,pEVar5);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar3 != 0;
            if (iVar3 == 0) {
              testing::Message::Message((Message *)&local_138);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_170,(internal *)&gtest_ar_,
                         (AssertionResult *)"X509_sign(leaf.get(), key.get(), EVP_sha256())","false"
                         ,"true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10ce,local_170._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar,(Message *)&local_138);
              goto LAB_003666ed;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            UVar2 = leaf;
            local_114 = 0;
            local_c8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l._M_len = 1;
            __l._M_array = (iterator)&local_c8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170,__l,&local_181);
            local_d8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)&local_d8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,__l_00,&local_182
                      );
            local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_38._M_unused._M_object = (void *)0x0;
            local_38._8_8_ = 0;
            local_28 = 0;
            uStack_20 = 0;
            local_f4 = Verify((X509 *)UVar2._M_t.
                                      super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                              (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_138,0,
                              (function<void_(x509_store_ctx_st_*)> *)&local_38);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"0",
                       "Verify(leaf.get(), {root1.get()}, {intermediate.get()}, {})",&local_114,
                       &local_f4);
            std::_Function_base::~_Function_base((_Function_base *)&local_38);
            std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                      (&local_138);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_170);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10d3,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_,(Message *)&local_170);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
              if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            UVar2 = leaf;
            local_114 = 10;
            local_d8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_01._M_len = 1;
            __l_01._M_array = (iterator)&local_d8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170,__l_01,&local_181
                      );
            local_c8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            local_c0.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root1_cross._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_02._M_len = 2;
            __l_02._M_array = (iterator)&local_c8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,__l_02,&local_182
                      );
            local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_58._M_unused._M_object = (void *)0x0;
            local_58._8_8_ = 0;
            local_48 = 0;
            uStack_40 = 0;
            local_f4 = Verify((X509 *)UVar2._M_t.
                                      super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                              (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_138,0,
                              (function<void_(x509_store_ctx_st_*)> *)&local_58);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"10",
                       "Verify(leaf.get(), {root2.get()}, {intermediate.get(), root1_cross.get()}, {})"
                       ,&local_114,&local_f4);
            std::_Function_base::~_Function_base((_Function_base *)&local_58);
            std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                      (&local_138);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_170);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10d6,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_,(Message *)&local_170);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
              if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            UVar2 = leaf;
            local_114 = 0;
            local_c8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            local_c0.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_03._M_len = 2;
            __l_03._M_array = (iterator)&local_c8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170,__l_03,&local_181
                      );
            local_d8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            local_d0.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root1_cross._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_04._M_len = 2;
            __l_04._M_array = (iterator)&local_d8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,__l_04,&local_182
                      );
            local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_78._M_unused._M_object = (void *)0x0;
            local_78._8_8_ = 0;
            local_68 = 0;
            uStack_60 = 0;
            local_f4 = Verify((X509 *)UVar2._M_t.
                                      super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                              (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_138,0,
                              (function<void_(x509_store_ctx_st_*)> *)&local_78);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"0",
                       "Verify(leaf.get(), {root1.get(), root2.get()}, {intermediate.get(), root1_cross.get()}, {})"
                       ,&local_114,&local_f4);
            std::_Function_base::~_Function_base((_Function_base *)&local_78);
            std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                      (&local_138);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_170);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10db,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_,(Message *)&local_170);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
              if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            UVar2 = leaf;
            local_114 = 10;
            local_c8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            local_c0.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_05._M_len = 2;
            __l_05._M_array = (iterator)&local_c8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170,__l_05,&local_181
                      );
            local_d8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            local_d0.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root1_cross._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_06._M_len = 2;
            __l_06._M_array = (iterator)&local_d8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,__l_06,&local_182
                      );
            local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_98._M_unused._M_object = (void *)0x0;
            local_98._8_8_ = 0;
            local_80 = std::
                       _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4324:3)>
                       ::_M_invoke;
            local_88 = std::
                       _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4324:3)>
                       ::_M_manager;
            local_f4 = Verify((X509 *)UVar2._M_t.
                                      super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                              (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_138,0,
                              (function<void_(x509_store_ctx_st_*)> *)&local_98);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"10",
                       "Verify(leaf.get(), {root1.get(), root2.get()}, {intermediate.get(), root1_cross.get()}, {}, 0, [&](X509_STORE_CTX *ctx) { X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx); X509_VERIFY_PARAM_clear_flags(param, 0x8000); })"
                       ,&local_114,&local_f4);
            std::_Function_base::~_Function_base((_Function_base *)&local_98);
            std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                      (&local_138);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_170);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10eb,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_,(Message *)&local_170);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
              if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            local_114 = 0;
            local_d8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_07._M_len = 1;
            __l_07._M_array = (iterator)&local_d8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170,__l_07,&local_181
                      );
            local_c8.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            local_c0.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                 root1_cross._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
            __l_08._M_len = 2;
            __l_08._M_array = (iterator)&local_c8;
            std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                      ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,__l_08,&local_182
                      );
            local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_b8._M_unused._M_object = (void *)0x0;
            local_b8._8_8_ = 0;
            local_a0 = std::
                       _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4335:3)>
                       ::_M_invoke;
            local_a8 = std::
                       _Function_handler<void_(x509_store_ctx_st_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc:4335:3)>
                       ::_M_manager;
            local_f4 = Verify((X509 *)leaf._M_t.
                                      super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170,
                              (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                              (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_138,0,
                              (function<void_(x509_store_ctx_st_*)> *)&local_b8);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"0",
                       "Verify(leaf.get(), {root1.get()}, {intermediate.get(), root1_cross.get()}, {}, 0, [&](X509_STORE_CTX *ctx) { X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx); X509_VERIFY_PARAM_clear_flags(param, 0x8000); })"
                       ,&local_114,&local_f4);
            std::_Function_base::~_Function_base((_Function_base *)&local_b8);
            std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                      (&local_138);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
            std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                      ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&local_170);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_170);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar6 = "";
              }
              else {
                pcVar6 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x10f5,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_,(Message *)&local_170);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
              if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
              }
            }
            this_00 = &gtest_ar.message_;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(this_00);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&leaf);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&intermediate);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&root1_cross);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&root1);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&root2);
LAB_00366d69:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST(X509Test, TrustedFirst) {
  // Generate the following certificates:
  //
  //                     Root 2 (in store, expired)
  //                       |
  // Root 1 (in store)   Root 1 (cross-sign)
  //          \           /
  //          Intermediate
  //                |
  //               Leaf
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  bssl::UniquePtr<X509> root2 =
      MakeTestCert("Root 2", "Root 2", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root2);
  ASSERT_TRUE(ASN1_TIME_adj(X509_getm_notAfter(root2.get()), kReferenceTime,
                            /*offset_day=*/0,
                            /*offset_sec=*/-1));
  ASSERT_TRUE(X509_sign(root2.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> root1 =
      MakeTestCert("Root 1", "Root 1", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root1);
  ASSERT_TRUE(X509_sign(root1.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> root1_cross =
      MakeTestCert("Root 2", "Root 1", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root1_cross);
  ASSERT_TRUE(X509_sign(root1_cross.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> intermediate =
      MakeTestCert("Root 1", "Intermediate", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(intermediate);
  ASSERT_TRUE(X509_sign(intermediate.get(), key.get(), EVP_sha256()));

  bssl::UniquePtr<X509> leaf =
      MakeTestCert("Intermediate", "Leaf", key.get(), /*is_ca=*/false);
  ASSERT_TRUE(leaf);
  ASSERT_TRUE(X509_sign(leaf.get(), key.get(), EVP_sha256()));

  // As a control, confirm that |leaf| -> |intermediate| -> |root1| is valid,
  // but the path through |root1_cross| is expired.
  EXPECT_EQ(X509_V_OK,
            Verify(leaf.get(), {root1.get()}, {intermediate.get()}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_HAS_EXPIRED,
            Verify(leaf.get(), {root2.get()},
                   {intermediate.get(), root1_cross.get()}, {}));

  // By default, we should find the |leaf| -> |intermediate| -> |root2| chain,
  // skipping |root1_cross|.
  EXPECT_EQ(X509_V_OK, Verify(leaf.get(), {root1.get(), root2.get()},
                              {intermediate.get(), root1_cross.get()}, {}));

  // When |X509_V_FLAG_TRUSTED_FIRST| is disabled, we get stuck on the expired
  // intermediate. Note we need the callback to clear the flag. Setting |flags|
  // to zero only skips setting new flags.
  //
  // This test exists to confirm our current behavior, but these modes are just
  // workarounds for not having an actual path-building verifier. If we fix it,
  // this test can be removed.
  EXPECT_EQ(X509_V_ERR_CERT_HAS_EXPIRED,
            Verify(leaf.get(), {root1.get(), root2.get()},
                   {intermediate.get(), root1_cross.get()}, {}, /*flags=*/0,
                   [&](X509_STORE_CTX *ctx) {
                     X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
                     X509_VERIFY_PARAM_clear_flags(param,
                                                   X509_V_FLAG_TRUSTED_FIRST);
                   }));

  // Even when |X509_V_FLAG_TRUSTED_FIRST| is disabled, if |root2| is not
  // trusted, the alt chains logic recovers the path.
  EXPECT_EQ(
      X509_V_OK,
      Verify(leaf.get(), {root1.get()}, {intermediate.get(), root1_cross.get()},
             {}, /*flags=*/0, [&](X509_STORE_CTX *ctx) {
               X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
               X509_VERIFY_PARAM_clear_flags(param, X509_V_FLAG_TRUSTED_FIRST);
             }));
}